

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O0

Flag<CredentialConfig> * __thiscall
(anonymous_namespace)::IntVectorFlag<CredentialConfig,unsigned_short>
          (Flag<CredentialConfig> *__return_storage_ptr__,_anonymous_namespace_ *this,char *name,
          offset_in_CredentialConfig_to_vector<unsigned_short,_std::allocator<unsigned_short>_>
          field,bool skip_handshaker)

{
  anon_class_8_1_a7e8901a local_30;
  byte local_21;
  char *pcStack_20;
  bool skip_handshaker_local;
  offset_in_CredentialConfig_to_vector<unsigned_short,_std::allocator<unsigned_short>_> field_local;
  char *name_local;
  
  local_21 = (byte)field & 1;
  __return_storage_ptr__->name = (char *)this;
  __return_storage_ptr__->has_param = true;
  __return_storage_ptr__->skip_handshaker = (bool)local_21;
  local_30.field =
       (offset_in_CredentialConfig_to_vector<unsigned_short,_std::allocator<unsigned_short>_>)name;
  pcStack_20 = name;
  field_local = (offset_in_CredentialConfig_to_vector<unsigned_short,_std::allocator<unsigned_short>_>
                 )this;
  name_local = (char *)__return_storage_ptr__;
  std::function<bool(CredentialConfig*,char_const*)>::
  function<(anonymous_namespace)::IntVectorFlag<CredentialConfig,unsigned_short>(char_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>CredentialConfig::*,bool)::_lambda(CredentialConfig*,char_const*)_1_,void>
            ((function<bool(CredentialConfig*,char_const*)> *)&__return_storage_ptr__->set_param,
             &local_30);
  return __return_storage_ptr__;
}

Assistant:

Flag<Config> IntVectorFlag(const char *name, std::vector<T> Config::*field,
                           bool skip_handshaker = false) {
  return Flag<Config>{name, true, skip_handshaker,
                      [=](Config *config, const char *param) -> bool {
                        T value;
                        if (!StringToInt(&value, param)) {
                          return false;
                        }
                        (config->*field).push_back(value);
                        return true;
                      }};
}